

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

int __thiscall google::protobuf::DescriptorProto::ByteSize(DescriptorProto *this)

{
  byte bVar1;
  string *psVar2;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  MessageOptions *this_00;
  long lVar7;
  
  bVar1 = (byte)this->_has_bits_[0];
  iVar4 = 0;
  if (bVar1 != 0) {
    if ((bVar1 & 1) != 0) {
      psVar2 = this->name_;
      uVar5 = (uint)psVar2->_M_string_length;
      iVar4 = 2;
      if (0x7f < uVar5) {
        iVar4 = io::CodedOutputStream::VarintSize32Fallback(uVar5);
        iVar4 = iVar4 + 1;
      }
      iVar4 = iVar4 + (int)psVar2->_M_string_length;
    }
    if ((this->_has_bits_[0] & 0x40) != 0) {
      this_00 = this->options_;
      if (this_00 == (MessageOptions *)0x0) {
        this_00 = *(MessageOptions **)(default_instance_ + 0x90);
      }
      uVar5 = MessageOptions::ByteSize(this_00);
      iVar6 = 1;
      if (0x7f < uVar5) {
        iVar6 = io::CodedOutputStream::VarintSize32Fallback(uVar5);
      }
      iVar4 = iVar4 + uVar5 + iVar6 + 1;
    }
  }
  iVar6 = (this->field_).super_RepeatedPtrFieldBase.current_size_;
  iVar4 = iVar4 + iVar6;
  if (0 < iVar6) {
    lVar7 = 0;
    do {
      uVar5 = FieldDescriptorProto::ByteSize
                        ((FieldDescriptorProto *)
                         (this->field_).super_RepeatedPtrFieldBase.elements_[lVar7]);
      iVar6 = 1;
      if (0x7f < uVar5) {
        iVar6 = io::CodedOutputStream::VarintSize32Fallback(uVar5);
      }
      iVar4 = iVar4 + uVar5 + iVar6;
      lVar7 = lVar7 + 1;
    } while (lVar7 < (this->field_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar6 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
  iVar4 = iVar4 + iVar6;
  if (0 < iVar6) {
    lVar7 = 0;
    do {
      uVar5 = FieldDescriptorProto::ByteSize
                        ((FieldDescriptorProto *)
                         (this->extension_).super_RepeatedPtrFieldBase.elements_[lVar7]);
      iVar6 = 1;
      if (0x7f < uVar5) {
        iVar6 = io::CodedOutputStream::VarintSize32Fallback(uVar5);
      }
      iVar4 = iVar4 + uVar5 + iVar6;
      lVar7 = lVar7 + 1;
    } while (lVar7 < (this->extension_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar6 = (this->nested_type_).super_RepeatedPtrFieldBase.current_size_;
  iVar4 = iVar4 + iVar6;
  if (0 < iVar6) {
    lVar7 = 0;
    do {
      uVar5 = ByteSize((DescriptorProto *)
                       (this->nested_type_).super_RepeatedPtrFieldBase.elements_[lVar7]);
      iVar6 = 1;
      if (0x7f < uVar5) {
        iVar6 = io::CodedOutputStream::VarintSize32Fallback(uVar5);
      }
      iVar4 = iVar4 + uVar5 + iVar6;
      lVar7 = lVar7 + 1;
    } while (lVar7 < (this->nested_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar6 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  iVar4 = iVar4 + iVar6;
  if (0 < iVar6) {
    lVar7 = 0;
    do {
      uVar5 = EnumDescriptorProto::ByteSize
                        ((EnumDescriptorProto *)
                         (this->enum_type_).super_RepeatedPtrFieldBase.elements_[lVar7]);
      iVar6 = 1;
      if (0x7f < uVar5) {
        iVar6 = io::CodedOutputStream::VarintSize32Fallback(uVar5);
      }
      iVar4 = iVar4 + uVar5 + iVar6;
      lVar7 = lVar7 + 1;
    } while (lVar7 < (this->enum_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar6 = (this->extension_range_).super_RepeatedPtrFieldBase.current_size_;
  iVar4 = iVar4 + iVar6;
  if (0 < iVar6) {
    lVar7 = 0;
    do {
      uVar5 = DescriptorProto_ExtensionRange::ByteSize
                        ((DescriptorProto_ExtensionRange *)
                         (this->extension_range_).super_RepeatedPtrFieldBase.elements_[lVar7]);
      iVar6 = 1;
      if (0x7f < uVar5) {
        iVar6 = io::CodedOutputStream::VarintSize32Fallback(uVar5);
      }
      iVar4 = iVar4 + uVar5 + iVar6;
      lVar7 = lVar7 + 1;
    } while (lVar7 < (this->extension_range_).super_RepeatedPtrFieldBase.current_size_);
  }
  pvVar3 = (this->_unknown_fields_).fields_;
  if ((pvVar3 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar3->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar3->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    iVar6 = internal::WireFormat::ComputeUnknownFieldsSize(&this->_unknown_fields_);
    iVar4 = iVar6 + iVar4;
  }
  this->_cached_size_ = iVar4;
  return iVar4;
}

Assistant:

int DescriptorProto::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    // optional string name = 1;
    if (has_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->name());
    }

    // optional .google.protobuf.MessageOptions options = 7;
    if (has_options()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->options());
    }

  }
  // repeated .google.protobuf.FieldDescriptorProto field = 2;
  total_size += 1 * this->field_size();
  for (int i = 0; i < this->field_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->field(i));
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 6;
  total_size += 1 * this->extension_size();
  for (int i = 0; i < this->extension_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->extension(i));
  }

  // repeated .google.protobuf.DescriptorProto nested_type = 3;
  total_size += 1 * this->nested_type_size();
  for (int i = 0; i < this->nested_type_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->nested_type(i));
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
  total_size += 1 * this->enum_type_size();
  for (int i = 0; i < this->enum_type_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->enum_type(i));
  }

  // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
  total_size += 1 * this->extension_range_size();
  for (int i = 0; i < this->extension_range_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->extension_range(i));
  }

  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}